

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O3

void __thiscall
backend::codegen::Codegen::emit_compare
          (Codegen *this,VarId *dest,Value *lhs,Value *rhs,ConditionCode cond,bool reversed)

{
  vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
  *this_00;
  Reg RVar1;
  Inst *pIVar2;
  undefined3 in_register_00000089;
  _Head_base<0UL,_arm::Inst_*,_false> local_80;
  Operand2 local_78;
  anon_class_8_1_a78179b7_conflict11 local_58;
  undefined1 local_50 [8];
  _Move_ctor_base<false,_arm::RegisterOperand,_int> local_48;
  
  if (CONCAT31(in_register_00000089,reversed) != 0) {
    cond = arm::reverse_cond(cond);
  }
  RVar1 = translate_value_to_reg(this,lhs);
  translate_value_to_operand2(&local_78,this,rhs);
  pIVar2 = (Inst *)operator_new(0x38);
  local_48.super__Copy_ctor_alias<arm::RegisterOperand,_int>.
  super__Variant_storage_alias<arm::RegisterOperand,_int>._M_index =
       local_78.super_variant<arm::RegisterOperand,_int>.
       super__Variant_base<arm::RegisterOperand,_int>.
       super__Move_assign_alias<arm::RegisterOperand,_int>.
       super__Copy_assign_alias<arm::RegisterOperand,_int>.
       super__Move_ctor_alias<arm::RegisterOperand,_int>.
       super__Copy_ctor_alias<arm::RegisterOperand,_int>.
       super__Variant_storage_alias<arm::RegisterOperand,_int>._M_index;
  local_58.__lhs = &local_48;
  (*std::__detail::__variant::
    __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_std::variant<arm::RegisterOperand,_int>_&&>
    ::_S_vtable._M_arr
    [(long)(char)local_78.super_variant<arm::RegisterOperand,_int>.
                 super__Variant_base<arm::RegisterOperand,_int>.
                 super__Move_assign_alias<arm::RegisterOperand,_int>.
                 super__Copy_assign_alias<arm::RegisterOperand,_int>.
                 super__Move_ctor_alias<arm::RegisterOperand,_int>.
                 super__Copy_ctor_alias<arm::RegisterOperand,_int>.
                 super__Variant_storage_alias<arm::RegisterOperand,_int>._M_index + 1]._M_data)
            (&local_58,&local_78.super_variant<arm::RegisterOperand,_int>);
  local_50 = (undefined1  [8])&PTR_display_001ed820;
  pIVar2->op = Cmp;
  pIVar2->cond = Always;
  (pIVar2->super_Displayable)._vptr_Displayable = (_func_int **)&PTR_display_001ed930;
  *(Reg *)&pIVar2[1].super_Displayable._vptr_Displayable = RVar1;
  local_58.__lhs = (_Move_ctor_base<false,_arm::RegisterOperand,_int> *)(pIVar2 + 2);
  *(__index_type *)&pIVar2[3].super_Displayable._vptr_Displayable =
       local_48.super__Copy_ctor_alias<arm::RegisterOperand,_int>.
       super__Variant_storage_alias<arm::RegisterOperand,_int>._M_index;
  (*std::__detail::__variant::
    __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_const_std::variant<arm::RegisterOperand,_int>_&>
    ::_S_vtable._M_arr
    [(long)(char)local_48.super__Copy_ctor_alias<arm::RegisterOperand,_int>.
                 super__Variant_storage_alias<arm::RegisterOperand,_int>._M_index + 1]._M_data)
            ((anon_class_8_1_a78179b7_conflict8 *)&local_58,
             (variant<arm::RegisterOperand,_int> *)&local_48);
  this_00 = &this->inst;
  *(undefined ***)&pIVar2[1].op = &PTR_display_001ed820;
  local_80._M_head_impl = pIVar2;
  std::
  vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
  ::emplace_back<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>
            ((vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
              *)this_00,(unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)&local_80);
  if (local_80._M_head_impl != (Inst *)0x0) {
    (*((local_80._M_head_impl)->super_Displayable)._vptr_Displayable[2])();
  }
  local_48.super__Copy_ctor_alias<arm::RegisterOperand,_int>.
  super__Variant_storage_alias<arm::RegisterOperand,_int>._M_u._M_rest =
       (_Variadic_union<int>)dest->id;
  local_50 = (undefined1  [8])&PTR_display_001eb100;
  RVar1 = get_or_alloc_vgp(this,(VarId *)local_50);
  local_78.super_Displayable._vptr_Displayable = (_func_int **)operator_new(0x38);
  *(undefined4 *)(local_78.super_Displayable._vptr_Displayable + 1) = 6;
  *(undefined1 *)((long)local_78.super_Displayable._vptr_Displayable + 0xc) = 0x10;
  *local_78.super_Displayable._vptr_Displayable = (_func_int *)&PTR_display_001ed930;
  *(Reg *)(local_78.super_Displayable._vptr_Displayable + 2) = RVar1;
  *(undefined1 *)(local_78.super_Displayable._vptr_Displayable + 6) = 1;
  *(undefined4 *)(local_78.super_Displayable._vptr_Displayable + 4) = 0;
  local_78.super_Displayable._vptr_Displayable[3] = (_func_int *)&PTR_display_001ed820;
  std::
  vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
  ::emplace_back<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>
            ((vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
              *)this_00,(unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)&local_78);
  if (local_78.super_Displayable._vptr_Displayable != (_func_int **)0x0) {
    (**(code **)(*local_78.super_Displayable._vptr_Displayable + 0x10))();
  }
  local_48.super__Copy_ctor_alias<arm::RegisterOperand,_int>.
  super__Variant_storage_alias<arm::RegisterOperand,_int>._M_u._M_rest =
       (_Variadic_union<int>)dest->id;
  local_50 = (undefined1  [8])&PTR_display_001eb100;
  RVar1 = get_or_alloc_vgp(this,(VarId *)local_50);
  local_78.super_Displayable._vptr_Displayable = (_func_int **)operator_new(0x38);
  *(undefined4 *)(local_78.super_Displayable._vptr_Displayable + 1) = 6;
  *(ConditionCode *)((long)local_78.super_Displayable._vptr_Displayable + 0xc) = cond;
  *local_78.super_Displayable._vptr_Displayable = (_func_int *)&PTR_display_001ed930;
  *(Reg *)(local_78.super_Displayable._vptr_Displayable + 2) = RVar1;
  *(undefined1 *)(local_78.super_Displayable._vptr_Displayable + 6) = 1;
  *(undefined4 *)(local_78.super_Displayable._vptr_Displayable + 4) = 1;
  local_78.super_Displayable._vptr_Displayable[3] = (_func_int *)&PTR_display_001ed820;
  std::
  vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
  ::emplace_back<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>
            ((vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
              *)this_00,(unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)&local_78);
  if (local_78.super_Displayable._vptr_Displayable != (_func_int **)0x0) {
    (**(code **)(*local_78.super_Displayable._vptr_Displayable + 0x10))();
  }
  return;
}

Assistant:

void Codegen::emit_compare(mir::inst::VarId& dest, mir::inst::Value& lhs,
                           mir::inst::Value& rhs, arm::ConditionCode cond,
                           bool reversed) {
  if (reversed) {
    cond = reverse_cond(cond);
  }
  inst.push_back(
      std::make_unique<Arith2Inst>(OpCode::Cmp, translate_value_to_reg(lhs),
                                   translate_value_to_operand2(rhs)));

  inst.push_back(std::make_unique<Arith2Inst>(
      OpCode::Mov, translate_var_reg(dest), Operand2(0)));
  inst.push_back(std::make_unique<Arith2Inst>(
      OpCode::Mov, translate_var_reg(dest), Operand2(1), cond));
}